

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall compiler::EmissionContext::PopScope(EmissionContext *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  allocator<char> local_31;
  string local_30;
  EmissionContext *local_10;
  EmissionContext *this_local;
  
  local_10 = this;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->scopeStartIndex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"PopScope called with empty scopeStartIndex",&local_31);
  Error::assertWithPanic(!bVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->scopeStartIndex);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->scopeStartIndex,sVar2 - 1);
  this->firstFreeVariablesIndex = *pvVar3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->scopeStartIndex);
  return;
}

Assistant:

void PopScope() {
    Error::assertWithPanic(!this->scopeStartIndex.empty(), "PopScope called with empty scopeStartIndex");

    this->firstFreeVariablesIndex = this->scopeStartIndex.at(this->scopeStartIndex.size() - 1);
    this->scopeStartIndex.pop_back();
  }